

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPiNum(pNtk);
  iVar2 = Abc_NtkPiNum(pNtkNew);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0xad,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar2 = Abc_NtkPoNum(pNtkNew);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0xae,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Nm_ManNumEntries(pNtk->pManName);
  if (iVar1 < 1) {
    __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0xaf,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Nm_ManNumEntries(pNtkNew->pManName);
  if (iVar1 != 0) {
    __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0xb0,"void Abc_NtkTrasferNamesNoLatches(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_24);
    iVar1 = Abc_ObjFaninNum(pAVar3);
    if (iVar1 == 0) {
LAB_0020172a:
      pAVar4 = (pAVar3->field_6).pCopy;
      pAVar3 = Abc_ObjFanout0Ntk(pAVar3);
      pcVar5 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
    }
    else {
      pAVar4 = Abc_ObjFanin0(pAVar3);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 == 0) goto LAB_0020172a;
    }
  }
  local_24 = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_24) {
      for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1;
          local_24 = local_24 + 1) {
        pAVar3 = Abc_NtkBox(pNtk,local_24);
        iVar1 = Abc_ObjIsLatch(pAVar3);
        if (iVar1 == 0) {
          pAVar4 = (pAVar3->field_6).pCopy;
          pcVar5 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
        }
      }
      return;
    }
    pAVar3 = Abc_NtkCo(pNtk,local_24);
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    if (iVar1 == 0) {
LAB_002017cd:
      pAVar4 = (pAVar3->field_6).pCopy;
      pAVar3 = Abc_ObjFanin0Ntk(pAVar3);
      pcVar5 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar5,(char *)0x0);
    }
    else {
      pAVar4 = Abc_ObjFanout0(pAVar3);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 == 0) goto LAB_002017cd;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Abc_NtkTrasferNamesNoLatches( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box name and skip latches and theirs inputs/outputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        if ( Abc_ObjFanoutNum(pObj) == 0 || !Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        if ( !Abc_ObjIsLatch(pObj) )
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}